

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

int evfilt_write_knote_disable(filter *filt,knote *kn)

{
  int iVar1;
  long in_RSI;
  _Bool in_stack_0000002b;
  int in_stack_0000002c;
  knote *in_stack_00000030;
  filter *in_stack_00000038;
  int in_stack_00000040;
  undefined4 local_4;
  
  if ((*(uint *)(in_RSI + 0x20) & 1) == 0) {
    local_4 = epoll_update(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c,
                           in_stack_0000002b);
  }
  else {
    iVar1 = epoll_ctl(*(int *)(in_RSI + 0x68),2,*(int *)(in_RSI + 0x80),(epoll_event *)0x0);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      *(undefined4 *)(in_RSI + 0x6c) = 0;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
evfilt_write_knote_disable(struct filter *filt, struct knote *kn)
{
    if (kn->kn_flags & KNFL_FILE) {
        if (epoll_ctl(kn->kn_epollfd, EPOLL_CTL_DEL, kn->kn_eventfd, NULL) < 0) {
            dbg_perror("epoll_ctl(2)");
            return (-1);
        }
        kn->kn_registered = 0;
        return (0);
    }

    return epoll_update(EPOLL_CTL_DEL, filt, kn, EPOLLOUT, false);
}